

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::TriageCompareEdgeDistance<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *a0,Vector3<long_double> *a1,
              longdouble r2)

{
  D *pDVar1;
  D *__return_storage_ptr__;
  int *piVar2;
  D *b;
  D *b_00;
  BasicVector<Vector3,_long_double,_3UL> *this;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble lVar4;
  longdouble in_ST1;
  longdouble lVar5;
  longdouble lVar6;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  double __x;
  __type_conflict _Var7;
  double __x_00;
  double __x_01;
  int local_26c;
  int local_1f0;
  int local_1ec [2];
  int local_1e4;
  int line_sign;
  int local_1dc;
  undefined1 auStack_1d8 [4];
  int vertex_sign;
  longdouble a1_sign_error;
  longdouble a0_sign_error;
  longdouble n1_error;
  longdouble n1;
  longdouble n2;
  longdouble a1_sign;
  longdouble a0_sign;
  Vector3<long_double> a1_dir;
  Vector3<long_double> a0_dir;
  Vector3<long_double> m;
  D local_a8;
  undefined1 local_78 [8];
  Vector3<long_double> n;
  longdouble T_ERR;
  longdouble r2_local;
  Vector3<long_double> *a1_local;
  Vector3<long_double> *a0_local;
  Vector3<long_double> *x_local;
  
  lVar3 = in_ST5;
  lVar4 = in_ST5;
  unique0x1000034a = (longdouble)5.421011e-20;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            (&local_a8,(BasicVector<Vector3,_long_double,_3UL> *)a0,a1);
  pDVar1 = (D *)((long)m.c_ + 0x28);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator+
            (pDVar1,(BasicVector<Vector3,_long_double,_3UL> *)a0,a1);
  Vector3<long_double>::CrossProd((Vector3<long_double> *)local_78,&local_a8,pDVar1);
  this = (BasicVector<Vector3,_long_double,_3UL> *)((long)a0_dir.c_ + 0x28);
  Vector3<long_double>::CrossProd((Vector3<long_double> *)this,(Vector3<long_double> *)local_78,x);
  pDVar1 = (D *)((long)a1_dir.c_ + 0x28);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            (pDVar1,(BasicVector<Vector3,_long_double,_3UL> *)a0,x);
  __return_storage_ptr__ = (D *)((long)&a0_sign + 8);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            (__return_storage_ptr__,(BasicVector<Vector3,_long_double,_3UL> *)a1,x);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::DotProd
            ((longdouble *)pDVar1,this,b);
  unique0x10000340 = in_ST0;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::DotProd
            ((longdouble *)__return_storage_ptr__,this,b_00);
  unique0x10000336 = in_ST1;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
            ((longdouble *)local_78,this);
  unique0x1000032c = in_ST2;
  std::sqrt(__x);
  unique0x10000322 = in_ST3;
  _Var7 = std::sqrt<int>(3);
  lVar5 = stack0xfffffffffffffe58 * (longdouble)(8.0 / _Var7 + 3.5);
  _Var7 = std::sqrt<int>(3);
  lVar6 = (longdouble)5.421011e-20 * ((longdouble)(_Var7 * 32.0 * 1.1102230246251565e-16) + lVar5);
  unique0x10000318 = lVar6;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
            ((FloatType *)pDVar1,this);
  lVar5 = stack0xfffffffffffffe48;
  register0x00001110 = lVar6 * in_ST4;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
            ((FloatType *)__return_storage_ptr__,this);
  _auStack_1d8 = lVar5 * in_ST5;
  __x_01 = std::fabs(__x_00);
  if ((lVar3 < stack0xfffffffffffffe38) || (std::fabs(__x_01), lVar4 < _auStack_1d8)) {
    line_sign = TriageCompareDistance<long_double>(x,a0,r2);
    local_1e4 = TriageCompareDistance<long_double>(x,a1,r2);
    piVar2 = std::min<int>(&line_sign,&local_1e4);
    local_1dc = *piVar2;
    local_26c = TriageCompareLineDistance<long_double>
                          (x,a0,a1,r2,(Vector3<long_double> *)local_78,stack0xfffffffffffffe58,
                           stack0xfffffffffffffe68);
    if (local_1dc != local_26c) {
      local_26c = 0;
    }
    x_local._4_4_ = local_26c;
  }
  else if (((longdouble)0 <= stack0xfffffffffffffe88) || (stack0xfffffffffffffe78 <= (longdouble)0))
  {
    local_1ec[0] = TriageCompareDistance<long_double>(x,a0,r2);
    local_1f0 = TriageCompareDistance<long_double>(x,a1,r2);
    piVar2 = std::min<int>(local_1ec,&local_1f0);
    x_local._4_4_ = *piVar2;
  }
  else {
    x_local._4_4_ =
         TriageCompareLineDistance<long_double>
                   (x,a0,a1,r2,(Vector3<long_double> *)local_78,stack0xfffffffffffffe58,
                    stack0xfffffffffffffe68);
  }
  return x_local._4_4_;
}

Assistant:

int TriageCompareEdgeDistance(const Vector3<T>& x, const Vector3<T>& a0,
                              const Vector3<T>& a1, T r2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // First we need to decide whether the closest point is an edge endpoint or
  // somewhere in the interior.  To determine this we compute a plane
  // perpendicular to (a0, a1) that passes through X.  Letting M be the normal
  // to this plane, the closest point is in the edge interior if and only if
  // a0.M < 0 and a1.M > 0.  Note that we can use "<" rather than "<=" because
  // if a0.M or a1.M is zero exactly then it doesn't matter which code path we
  // follow (since the distance to an endpoint and the distance to the edge
  // interior are exactly the same in this case).
  Vector3<T> n = (a0 - a1).CrossProd(a0 + a1);
  Vector3<T> m = n.CrossProd(x);
  // For better accuracy when the edge (a0,a1) is very short, we subtract "x"
  // before computing the dot products with M.
  Vector3<T> a0_dir = a0 - x;
  Vector3<T> a1_dir = a1 - x;
  T a0_sign = a0_dir.DotProd(m);
  T a1_sign = a1_dir.DotProd(m);
  T n2 = n.Norm2();
  T n1 = sqrt(n2);
  T n1_error = ((3.5 + 8 / sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T a0_sign_error = n1_error * a0_dir.Norm();
  T a1_sign_error = n1_error * a1_dir.Norm();
  if (fabs(a0_sign) < a0_sign_error || fabs(a1_sign) < a1_sign_error) {
    // It is uncertain whether minimum distance is to an edge vertex or to the
    // edge interior.  We handle this by computing both distances and checking
    // whether they yield the same result.
    int vertex_sign = min(TriageCompareDistance(x, a0, r2),
                          TriageCompareDistance(x, a1, r2));
    int line_sign = TriageCompareLineDistance(x, a0, a1, r2, n, n1, n2);
    return (vertex_sign == line_sign) ? line_sign : 0;
  }
  if (a0_sign >= 0 || a1_sign <= 0) {
    // The minimum distance is to an edge endpoint.
    return min(TriageCompareDistance(x, a0, r2),
               TriageCompareDistance(x, a1, r2));
  } else {
    // The minimum distance is to the edge interior.
    return TriageCompareLineDistance(x, a0, a1, r2, n, n1, n2);
  }
}